

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dSFMT.c
# Opt level: O0

void dsfmt_chk_init_by_array(dsfmt_t *dsfmt,uint32_t *init_key,int key_length,int mexp)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  int size;
  int mid;
  int lag;
  uint32_t *psfmt32;
  uint32_t r;
  int count;
  int j;
  int i;
  int mexp_local;
  int key_length_local;
  uint32_t *init_key_local;
  dsfmt_t *dsfmt_local;
  
  if (mexp == 0x4de1) {
    memset(dsfmt,0x8b,0xc00);
    if (key_length + 1 < 0x301) {
      psfmt32._4_4_ = 0x300;
    }
    else {
      psfmt32._4_4_ = key_length + 1;
    }
    iVar4 = idxof(0);
    uVar1 = dsfmt->status[0].u32[iVar4];
    iVar4 = idxof(0x17a);
    uVar2 = dsfmt->status[0].u32[iVar4];
    iVar4 = idxof(0x2ff);
    uVar5 = ini_func1(uVar1 ^ uVar2 ^ dsfmt->status[0].u32[iVar4]);
    iVar4 = idxof(0x17a);
    dsfmt->status[0].u32[iVar4] = uVar5 + dsfmt->status[0].u32[iVar4];
    iVar4 = idxof(0x185);
    dsfmt->status[0].u32[iVar4] = key_length + uVar5 + dsfmt->status[0].u32[iVar4];
    iVar4 = idxof(0);
    dsfmt->status[0].u32[iVar4] = key_length + uVar5;
    count = 1;
    for (r = 0; (int)r < psfmt32._4_4_ + -1 && (int)r < key_length; r = r + 1) {
      iVar4 = idxof(count);
      uVar1 = dsfmt->status[0].u32[iVar4];
      iVar4 = idxof((count + 0x17a) % 0x300);
      uVar2 = dsfmt->status[0].u32[iVar4];
      iVar4 = idxof((count + 0x2ff) % 0x300);
      uVar5 = ini_func1(uVar1 ^ uVar2 ^ dsfmt->status[0].u32[iVar4]);
      iVar4 = idxof((count + 0x17a) % 0x300);
      dsfmt->status[0].u32[iVar4] = uVar5 + dsfmt->status[0].u32[iVar4];
      uVar5 = init_key[(int)r] + count + uVar5;
      iVar4 = idxof((count + 0x185) % 0x300);
      dsfmt->status[0].u32[iVar4] = uVar5 + dsfmt->status[0].u32[iVar4];
      iVar4 = idxof(count);
      dsfmt->status[0].u32[iVar4] = uVar5;
      count = (count + 1) % 0x300;
    }
    for (; (int)r < psfmt32._4_4_ + -1; r = r + 1) {
      iVar4 = idxof(count);
      uVar1 = dsfmt->status[0].u32[iVar4];
      iVar4 = idxof((count + 0x17a) % 0x300);
      uVar2 = dsfmt->status[0].u32[iVar4];
      iVar4 = idxof((count + 0x2ff) % 0x300);
      uVar5 = ini_func1(uVar1 ^ uVar2 ^ dsfmt->status[0].u32[iVar4]);
      iVar4 = idxof((count + 0x17a) % 0x300);
      dsfmt->status[0].u32[iVar4] = uVar5 + dsfmt->status[0].u32[iVar4];
      iVar4 = idxof((count + 0x185) % 0x300);
      dsfmt->status[0].u32[iVar4] = count + uVar5 + dsfmt->status[0].u32[iVar4];
      iVar4 = idxof(count);
      dsfmt->status[0].u32[iVar4] = count + uVar5;
      count = (count + 1) % 0x300;
    }
    for (r = 0; (int)r < 0x300; r = r + 1) {
      iVar4 = idxof(count);
      uVar5 = dsfmt->status[0].u32[iVar4];
      iVar4 = idxof((count + 0x17a) % 0x300);
      uVar3 = dsfmt->status[0].u32[iVar4];
      iVar4 = idxof((count + 0x2ff) % 0x300);
      uVar5 = ini_func2(uVar5 + uVar3 + dsfmt->status[0].u32[iVar4]);
      iVar4 = idxof((count + 0x17a) % 0x300);
      dsfmt->status[0].u32[iVar4] = uVar5 ^ dsfmt->status[0].u32[iVar4];
      iVar4 = idxof((count + 0x185) % 0x300);
      dsfmt->status[0].u32[iVar4] = uVar5 - count ^ dsfmt->status[0].u32[iVar4];
      iVar4 = idxof(count);
      dsfmt->status[0].u32[iVar4] = uVar5 - count;
      count = (count + 1) % 0x300;
    }
    initial_mask(dsfmt);
    period_certification(dsfmt);
    dsfmt->idx = 0x17e;
    return;
  }
  fprintf(_stderr,"DSFMT_MEXP doesn\'t match with dSFMT.c\n");
  exit(1);
}

Assistant:

void dsfmt_chk_init_by_array(dsfmt_t* dsfmt, uint32_t init_key[],
                             int key_length, int mexp)
{
	int i, j, count;
	uint32_t r;
	uint32_t* psfmt32;
	int lag;
	int mid;
	int size = (DSFMT_N + 1) * 4; /* pulmonary */

	/* make sure caller program is compiled with the same MEXP */
	if (mexp != dsfmt_mexp)
	{
		fprintf(stderr, "DSFMT_MEXP doesn't match with dSFMT.c\n");
		exit(1);
	}
	if (size >= 623)
	{
		lag = 11;
	}
	else if (size >= 68)
	{
		lag = 7;
	}
	else if (size >= 39)
	{
		lag = 5;
	}
	else
	{
		lag = 3;
	}
	mid = (size - lag) / 2;

	psfmt32 = &dsfmt->status[0].u32[0];
	memset(dsfmt->status, 0x8b, sizeof(dsfmt->status));
	if (key_length + 1 > size)
	{
		count = key_length + 1;
	}
	else
	{
		count = size;
	}
	r = ini_func1(psfmt32[idxof(0)] ^ psfmt32[idxof(mid % size)]
		^ psfmt32[idxof((size - 1) % size)]);
	psfmt32[idxof(mid % size)] += r;
	r += key_length;
	psfmt32[idxof((mid + lag) % size)] += r;
	psfmt32[idxof(0)] = r;
	count--;
	for (i = 1, j = 0; (j < count) && (j < key_length); j++)
	{
		r = ini_func1(psfmt32[idxof(i)]
			^ psfmt32[idxof((i + mid) % size)]
			^ psfmt32[idxof((i + size - 1) % size)]);
		psfmt32[idxof((i + mid) % size)] += r;
		r += init_key[j] + i;
		psfmt32[idxof((i + mid + lag) % size)] += r;
		psfmt32[idxof(i)] = r;
		i = (i + 1) % size;
	}
	for (; j < count; j++)
	{
		r = ini_func1(psfmt32[idxof(i)]
			^ psfmt32[idxof((i + mid) % size)]
			^ psfmt32[idxof((i + size - 1) % size)]);
		psfmt32[idxof((i + mid) % size)] += r;
		r += i;
		psfmt32[idxof((i + mid + lag) % size)] += r;
		psfmt32[idxof(i)] = r;
		i = (i + 1) % size;
	}
	for (j = 0; j < size; j++)
	{
		r = ini_func2(psfmt32[idxof(i)]
			+ psfmt32[idxof((i + mid) % size)]
			+ psfmt32[idxof((i + size - 1) % size)]);
		psfmt32[idxof((i + mid) % size)] ^= r;
		r -= i;
		psfmt32[idxof((i + mid + lag) % size)] ^= r;
		psfmt32[idxof(i)] = r;
		i = (i + 1) % size;
	}
	initial_mask(dsfmt);
	period_certification(dsfmt);
	dsfmt->idx = DSFMT_N64;
}